

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

bool __thiscall
QDirSortItemComparator::operator()(QDirSortItemComparator *this,QDirSortItem *n1,QDirSortItem *n2)

{
  bool bVar1;
  bool bVar2;
  Int IVar3;
  int iVar4;
  qint64 qVar5;
  long in_RDX;
  long in_FS_OFFSET;
  int sortBy;
  qint64 r;
  CaseSensitivity qtcase;
  bool ic;
  QDirSortItem *f2;
  QDirSortItem *f1;
  QDateTime secondModified;
  QDateTime firstModified;
  undefined4 in_stack_fffffffffffffee8;
  Initialization in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  CaseSensitivity in_stack_fffffffffffffef4;
  QString *in_stack_fffffffffffffef8;
  QString *in_stack_ffffffffffffff00;
  QDirSortItemComparator *in_stack_ffffffffffffff08;
  QFileInfo *in_stack_ffffffffffffff10;
  QString *local_a8;
  bool local_6d;
  QFlagsStorageHelper<QDir::SortFlag,_4> local_6c;
  undefined1 *local_30;
  undefined1 *local_20;
  QFlagsStorageHelper<QDir::SortFlag,_4> local_18;
  QFlagsStorageHelper<QDir::SortFlag,_4> local_14;
  QFlagsStorageHelper<QDir::SortFlag,_4> local_10;
  QFlagsStorageHelper<QDir::SortFlag,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c.super_QFlagsStorage<QDir::SortFlag>.i =
       (QFlagsStorage<QDir::SortFlag>)
       QFlags<QDir::SortFlag>::operator&
                 ((QFlags<QDir::SortFlag> *)
                  CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                  in_stack_fffffffffffffeec);
  bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_c);
  bVar2 = false;
  if (bVar1) {
    bVar2 = QFileInfo::isDir(in_stack_ffffffffffffff10);
    bVar1 = QFileInfo::isDir(in_stack_ffffffffffffff10);
    bVar2 = bVar2 != bVar1;
  }
  if (bVar2) {
    local_6d = QFileInfo::isDir(in_stack_ffffffffffffff10);
  }
  else {
    local_10.super_QFlagsStorage<QDir::SortFlag>.i =
         (QFlagsStorage<QDir::SortFlag>)
         QFlags<QDir::SortFlag>::operator&
                   ((QFlags<QDir::SortFlag> *)
                    CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                    in_stack_fffffffffffffeec);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_10);
    bVar2 = false;
    if (bVar1) {
      bVar2 = QFileInfo::isDir(in_stack_ffffffffffffff10);
      bVar1 = QFileInfo::isDir(in_stack_ffffffffffffff10);
      bVar2 = bVar2 != bVar1;
    }
    if (bVar2) {
      bVar2 = QFileInfo::isDir(in_stack_ffffffffffffff10);
      local_6d = (bool)((bVar2 ^ 0xffU) & 1);
    }
    else {
      QFlags<QDir::SortFlag>::testAnyFlag
                ((QFlags<QDir::SortFlag> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 in_stack_fffffffffffffeec);
      local_a8 = (QString *)0x0;
      local_18.super_QFlagsStorage<QDir::SortFlag>.i =
           (QFlagsStorage<QDir::SortFlag>)
           QFlags<QDir::SortFlag>::operator&
                     ((QFlags<QDir::SortFlag> *)
                      CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                      in_stack_fffffffffffffeec);
      QFlags<QDir::SortFlag>::operator&
                ((QFlags<QDir::SortFlag> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 in_stack_fffffffffffffeec);
      local_14.super_QFlagsStorage<QDir::SortFlag>.i =
           (QFlagsStorage<QDir::SortFlag>)
           QFlags<QDir::SortFlag>::operator|
                     ((QFlags<QDir::SortFlag> *)
                      CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                      (QFlagsStorageHelper<QDir::SortFlag,_4>)SUB84(in_stack_fffffffffffffef8,0));
      IVar3 = QFlags<QDir::SortFlag>::toInt((QFlags<QDir::SortFlag> *)&local_14);
      if (IVar3 == 1) {
        local_20 = &DAT_aaaaaaaaaaaaaaaa;
        QTimeZone::QTimeZone
                  ((QTimeZone *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   in_stack_fffffffffffffeec);
        QFileInfo::lastModified
                  ((QFileInfo *)in_stack_fffffffffffffef8,
                   (QTimeZone *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        QTimeZone::~QTimeZone((QTimeZone *)0x27cb54);
        local_30 = &DAT_aaaaaaaaaaaaaaaa;
        in_stack_ffffffffffffff08 = (QDirSortItemComparator *)(in_RDX + 0x30);
        QTimeZone::QTimeZone
                  ((QTimeZone *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   in_stack_fffffffffffffeec);
        QFileInfo::lastModified
                  ((QFileInfo *)in_stack_fffffffffffffef8,
                   (QTimeZone *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        QTimeZone::~QTimeZone((QTimeZone *)0x27cbb4);
        local_a8 = (QString *)
                   QDateTime::msecsTo((QDateTime *)in_stack_fffffffffffffef8,
                                      (QDateTime *)
                                      CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0))
        ;
        in_stack_ffffffffffffff00 = local_a8;
        QDateTime::~QDateTime((QDateTime *)0x27cbe7);
        QDateTime::~QDateTime((QDateTime *)0x27cbf4);
      }
      else if (IVar3 == 2) {
        in_stack_fffffffffffffef8 = (QString *)QFileInfo::size(in_stack_ffffffffffffff10);
        qVar5 = QFileInfo::size(in_stack_ffffffffffffff10);
        local_a8 = (QString *)((long)in_stack_fffffffffffffef8 - qVar5);
      }
      else if (IVar3 == 0x80) {
        iVar4 = compareStrings(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                               in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
        local_a8 = (QString *)(long)iVar4;
      }
      if ((local_a8 == (QString *)0x0) && (IVar3 != 3)) {
        bVar2 = QString::isNull((QString *)0x27ccfd);
        if (bVar2) {
          QFileInfo::fileName((QFileInfo *)in_stack_ffffffffffffff08);
          QString::operator=((QString *)
                             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                             (QString *)
                             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
          QString::~QString((QString *)0x27cd3e);
        }
        bVar2 = QString::isNull((QString *)0x27cd4b);
        if (bVar2) {
          QFileInfo::fileName((QFileInfo *)in_stack_ffffffffffffff08);
          QString::operator=((QString *)
                             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                             (QString *)
                             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
          QString::~QString((QString *)0x27cd8c);
        }
        iVar4 = compareStrings(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                               in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
        local_a8 = (QString *)(long)iVar4;
      }
      local_6c.super_QFlagsStorage<QDir::SortFlag>.i =
           (QFlagsStorage<QDir::SortFlag>)
           QFlags<QDir::SortFlag>::operator&
                     ((QFlags<QDir::SortFlag> *)
                      CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                      in_stack_fffffffffffffeec);
      bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_6c);
      if (bVar2) {
        local_6d = 0 < (long)local_a8;
      }
      else {
        local_6d = (long)local_a8 < 0;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_6d;
}

Assistant:

bool QDirSortItemComparator::operator()(const QDirSortItem &n1, const QDirSortItem &n2) const
{
    const QDirSortItem* f1 = &n1;
    const QDirSortItem* f2 = &n2;

    if ((qt_cmp_si_sort_flags & QDir::DirsFirst) && (f1->item.isDir() != f2->item.isDir()))
        return f1->item.isDir();
    if ((qt_cmp_si_sort_flags & QDir::DirsLast) && (f1->item.isDir() != f2->item.isDir()))
        return !f1->item.isDir();

    const bool ic = qt_cmp_si_sort_flags.testAnyFlag(QDir::IgnoreCase);
    const auto qtcase = ic ? Qt::CaseInsensitive : Qt::CaseSensitive;

    qint64 r = 0;
    int sortBy = ((qt_cmp_si_sort_flags & QDir::SortByMask)
                 | (qt_cmp_si_sort_flags & QDir::Type)).toInt();

    switch (sortBy) {
      case QDir::Time: {
        const QDateTime firstModified = f1->item.lastModified(QTimeZone::UTC);
        const QDateTime secondModified = f2->item.lastModified(QTimeZone::UTC);
        r = firstModified.msecsTo(secondModified);
        break;
      }
      case QDir::Size:
          r = f2->item.size() - f1->item.size();
        break;
    case QDir::Type:
        r = compareStrings(f1->suffix_cache, f2->suffix_cache, qtcase);
        break;
      default:
        ;
    }

    if (r == 0 && sortBy != QDir::Unsorted) {
        // Still not sorted - sort by name

        if (f1->filename_cache.isNull())
            f1->filename_cache = f1->item.fileName();
        if (f2->filename_cache.isNull())
            f2->filename_cache = f2->item.fileName();

        r = compareStrings(f1->filename_cache, f2->filename_cache, qtcase);
    }
    if (qt_cmp_si_sort_flags & QDir::Reversed)
        return r > 0;
    return r < 0;
}